

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task.cpp
# Opt level: O3

MPP_RET mpp_task_meta_get_frame(MppTask task,MppMetaKey key,MppFrame *frame)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  
  MVar1 = check_mpp_task_name(task);
  MVar2 = MPP_NOK;
  if (MVar1 == MPP_OK) {
    MVar2 = mpp_meta_get_frame(*(MppMeta *)((long)task + 0x28),key,frame);
    if (MVar2 == MPP_OK) {
      MVar2 = MPP_OK;
    }
    else {
      *frame = (MppFrame)0x0;
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_task_meta_get_frame(MppTask task, MppMetaKey key, MppFrame *frame)
{
    if (check_mpp_task_name(task))
        return MPP_NOK;

    MppTaskImpl *impl = (MppTaskImpl *)task;
    MPP_RET ret = mpp_meta_get_frame(impl->meta, key, frame);
    if (ret)
        *frame = NULL;
    return ret;
}